

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O2

void __thiscall
TwoStageDynamicBayesianNetwork::ScopeBackup
          (TwoStageDynamicBayesianNetwork *this,Scope *stateScope,Scope *agentScope,Scope *X,
          Scope *A)

{
  uint uVar1;
  const_reference pvVar2;
  pointer puVar3;
  Scope O;
  Scope Y;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&stateScope->super_SDT
            );
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,&agentScope->super_SDT
            );
  ComputeWithinNextStageClosure(this,(Scope *)&local_48,(Scope *)&local_60);
  puVar3 = (X->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((X->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (X->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  puVar3 = (A->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((A->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (A->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  for (puVar3 = local_48._M_impl.super__Vector_impl_data._M_start;
      puVar3 != local_48._M_impl.super__Vector_impl_data._M_finish; puVar3 = puVar3 + 1) {
    uVar1 = *puVar3;
    pvVar2 = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_XSoI_Y,(ulong)uVar1);
    Scope::Insert(X,pvVar2);
    pvVar2 = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_ASoI_Y,(ulong)uVar1);
    Scope::Insert(A,pvVar2);
  }
  for (puVar3 = local_60._M_impl.super__Vector_impl_data._M_start;
      puVar3 != local_60._M_impl.super__Vector_impl_data._M_finish; puVar3 = puVar3 + 1) {
    pvVar2 = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_XSoI_O,(ulong)*puVar3);
    Scope::Insert(X,pvVar2);
    pvVar2 = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_ASoI_O,(ulong)*puVar3);
    Scope::Insert(A,pvVar2);
  }
  Scope::Sort(X);
  Scope::Sort(A);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void TwoStageDynamicBayesianNetwork::
ScopeBackup(    const Scope & stateScope, 
                const Scope & agentScope,
                Scope & X,
                Scope & A) const
{
    //first we compute the 'closure' of the NS state factors Y and
    //observations O. I.e., within stage connections can grow the set
    //of Y and O that need to be considered:
    Scope Y = stateScope;
    Scope O = agentScope;
    ComputeWithinNextStageClosure(Y,O);    

    X.clear();
    A.clear();
    //Next we do the backup of the Ys and Os
    for( Scope::iterator y_it = Y.begin(); y_it != Y.end(); y_it++)
    {
        Index yI = *y_it;
        X.Insert( _m_XSoI_Y.at(yI) );
        A.Insert( _m_ASoI_Y.at(yI) );
    }
    for( Scope::iterator o_it = O.begin(); o_it != O.end(); o_it++)
    {
        X.Insert( _m_XSoI_O.at(*o_it) );
        A.Insert( _m_ASoI_O.at(*o_it) );
    }
    X.Sort();
    A.Sort();
    return;
}